

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryCase::iterate
          (PrimitivesGeneratedQueryCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  RenderContext *pRVar6;
  long lVar7;
  uint local_5b4;
  MessageBuilder local_508;
  uint local_384;
  undefined1 local_380 [4];
  deUint32 expectedGenerated;
  int local_200;
  undefined4 local_1fc;
  int oneLocation;
  int positionLocation;
  Query query;
  Buffer buffer;
  VertexArray vao;
  Functions *gl;
  MessageBuilder local_198;
  uint local_14;
  PrimitivesGeneratedQueryCase *pPStack_10;
  GLuint primitivesGenerated;
  PrimitivesGeneratedQueryCase *this_local;
  undefined4 extraout_var;
  
  local_14 = 0xdebadbad;
  pPStack_10 = this;
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_198,
                      (char (*) [71])
                      "Drawing 8 points, setting a_one for each to value (1.0, 1.0, 1.0, 1.0)");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  if ((Functional::(anonymous_namespace)::PrimitivesGeneratedQueryCase::iterate()::vertexData ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::PrimitivesGeneratedQueryCase::
                                   iterate()::vertexData), iVar2 != 0)) {
    tcu::Vector<float,_4>::Vector(iterate::vertexData,0.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 1,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 2,0.1,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 3,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 4,0.2,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 5,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 6,0.3,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 7,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 8,0.4,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 9,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 10,0.5,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 0xb,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 0xc,0.6,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 0xd,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 0xe,0.7,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(iterate::vertexData + 0xf,1.0,1.0,1.0,1.0);
    __cxa_guard_release(&Functional::(anonymous_namespace)::PrimitivesGeneratedQueryCase::iterate()
                         ::vertexData);
  }
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&buffer.super_ObjectWrapper.m_object,pRVar6);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&query.super_ObjectWrapper.m_object,pRVar6);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)6> *)&oneLocation,pRVar6);
  pcVar1 = *(code **)(lVar7 + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  local_1fc = (*pcVar1)(dVar3,"a_position");
  pcVar1 = *(code **)(lVar7 + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  local_200 = (*pcVar1)(dVar3,"a_one");
  pcVar1 = *(code **)(lVar7 + 0xd8);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&buffer.super_ObjectWrapper.m_object);
  (*pcVar1)(dVar3);
  pcVar1 = *(code **)(lVar7 + 0x40);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&query.super_ObjectWrapper.m_object);
  (*pcVar1)(0x8892,dVar3);
  (**(code **)(lVar7 + 0x150))(0x8892,0x100,iterate::vertexData,0x88e4);
  (**(code **)(lVar7 + 0x19f0))(local_1fc,4,0x1406,0,0x20,0);
  (**(code **)(lVar7 + 0x610))(local_1fc);
  if (local_200 != -1) {
    (**(code **)(lVar7 + 0x19f0))(local_200,4,0x1406,0,0x20,0x10);
    (**(code **)(lVar7 + 0x610))(local_200);
  }
  pcVar1 = *(code **)(lVar7 + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar1)(dVar3);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"setup render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1288);
  pcVar1 = *(code **)(lVar7 + 0x20);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&oneLocation);
  (*pcVar1)(0x8c87,dVar3);
  (**(code **)(lVar7 + 0x538))(0,0,8);
  (**(code **)(lVar7 + 0x628))(0x8c87);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"render and query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x128e);
  pcVar1 = *(code **)(lVar7 + 0xa20);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&oneLocation);
  (*pcVar1)(dVar3,0x8866,&local_14);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"get query result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1291);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)6> *)&oneLocation);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&query.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&buffer.super_ObjectWrapper.m_object);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_380,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_380,(char (*) [27])"GL_PRIMITIVES_GENERATED = ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_14);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_380);
  if (this->m_test == TEST_AMPLIFICATION) {
    local_5b4 = 0x18;
  }
  else {
    local_5b4 = 8;
    if (this->m_test == TEST_INSTANCED) {
      local_5b4 = 0x20;
    }
  }
  local_384 = local_5b4;
  if (local_5b4 == local_14) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "got wrong result for GL_PRIMITIVES_GENERATED");
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_508,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_508,
                        (char (*) [61])
                        "Got unexpected result for GL_PRIMITIVES_GENERATED. Expected ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_384);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2c59494);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_14);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_508);
  }
  return STOP;
}

Assistant:

PrimitivesGeneratedQueryCase::IterateResult PrimitivesGeneratedQueryCase::iterate (void)
{
	glw::GLuint primitivesGenerated = 0xDEBADBAD;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Drawing 8 points, setting a_one for each to value (1.0, 1.0, 1.0, 1.0)"
		<< tcu::TestLog::EndMessage;

	{
		static const tcu::Vec4 vertexData[8*2] =
		{
			tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.1f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.2f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.3f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.4f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.6f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.7f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		};

		const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
		const glu::VertexArray	vao					(m_context.getRenderContext());
		const glu::Buffer		buffer				(m_context.getRenderContext());
		const glu::Query		query				(m_context.getRenderContext());
		const int				positionLocation	= gl.getAttribLocation(m_program->getProgram(), "a_position");
		const int				oneLocation			= gl.getAttribLocation(m_program->getProgram(), "a_one");

		gl.bindVertexArray(*vao);

		gl.bindBuffer(GL_ARRAY_BUFFER, *buffer);
		gl.bufferData(GL_ARRAY_BUFFER, (int)sizeof(vertexData), vertexData, GL_STATIC_DRAW);

		gl.vertexAttribPointer(positionLocation, 4, GL_FLOAT, GL_FALSE, 2 * (int)sizeof(tcu::Vec4), DE_NULL);
		gl.enableVertexAttribArray(positionLocation);

		if (oneLocation != -1)
		{
			gl.vertexAttribPointer(oneLocation, 4, GL_FLOAT, GL_FALSE, 2 * (int)sizeof(tcu::Vec4), (const tcu::Vec4*)DE_NULL + 1);
			gl.enableVertexAttribArray(oneLocation);
		}

		gl.useProgram(m_program->getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "setup render");

		gl.beginQuery(GL_PRIMITIVES_GENERATED, *query);
		gl.drawArrays(GL_POINTS, 0, 8);
		gl.endQuery(GL_PRIMITIVES_GENERATED);

		GLU_EXPECT_NO_ERROR(gl.getError(), "render and query");

		gl.getQueryObjectuiv(*query, GL_QUERY_RESULT, &primitivesGenerated);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get query result");
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_PRIMITIVES_GENERATED = " << primitivesGenerated
		<< tcu::TestLog::EndMessage;

	{
		const deUint32 expectedGenerated = (m_test == TEST_AMPLIFICATION) ? (3*8) : (m_test == TEST_INSTANCED) ? (8*(3+1)) : (8);

		if (expectedGenerated == primitivesGenerated)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong result for GL_PRIMITIVES_GENERATED");
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Got unexpected result for GL_PRIMITIVES_GENERATED. Expected " << expectedGenerated << ", got " << primitivesGenerated
				<< tcu::TestLog::EndMessage;
		}
	}

	return STOP;
}